

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O1

int lupdate(lua_State *L)

{
  int *piVar1;
  stm_copy *copy;
  undefined4 uVar2;
  size_t __n;
  int iVar3;
  undefined8 *puVar4;
  void *__dest;
  char *__src;
  undefined4 *puVar5;
  size_t sz;
  size_t local_30;
  
  puVar4 = (undefined8 *)lua_touserdata(L,1);
  iVar3 = lua_isuserdata(L,2);
  if (iVar3 == 0) {
    __src = luaL_checklstring(L,2,&local_30);
    __n = local_30;
    __dest = malloc(local_30);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,2);
    local_30 = luaL_checkinteger(L,3);
  }
  piVar1 = (int *)*puVar4;
  uVar2 = (undefined4)local_30;
  puVar5 = (undefined4 *)malloc(0x10);
  *puVar5 = 1;
  puVar5[1] = uVar2;
  *(void **)(puVar5 + 2) = __dest;
  do {
    LOCK();
    iVar3 = *piVar1;
    *piVar1 = 1;
    UNLOCK();
  } while (iVar3 != 0);
  do {
  } while (piVar1[1] != 0);
  copy = *(stm_copy **)(piVar1 + 4);
  *(undefined4 **)(piVar1 + 4) = puVar5;
  *piVar1 = 0;
  stm_releasecopy(copy);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	void * msg;
	size_t sz;
	if (lua_isuserdata(L, 2)) {
		msg = lua_touserdata(L, 2);
		sz = (size_t)luaL_checkinteger(L, 3);
	} else {
		const char * tmp = luaL_checklstring(L,2,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	stm_update(box->obj, msg, sz);

	return 0;
}